

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O1

void coda_product_type_delete(coda_product_type *product_type)

{
  long lVar1;
  
  if (product_type->name != (char *)0x0) {
    free(product_type->name);
  }
  if (product_type->description != (char *)0x0) {
    free(product_type->description);
  }
  if (product_type->hash_data != (hashtable *)0x0) {
    coda_hashtable_delete(product_type->hash_data);
  }
  if (product_type->product_definition != (coda_product_definition **)0x0) {
    if (0 < product_type->num_product_definitions) {
      lVar1 = 0;
      do {
        coda_product_definition_delete(product_type->product_definition[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < product_type->num_product_definitions);
    }
    free(product_type->product_definition);
  }
  free(product_type);
  return;
}

Assistant:

void coda_product_type_delete(coda_product_type *product_type)
{
    int i;

    if (product_type->name != NULL)
    {
        free(product_type->name);
    }
    if (product_type->description != NULL)
    {
        free(product_type->description);
    }
    if (product_type->hash_data != NULL)
    {
        hashtable_delete(product_type->hash_data);
    }
    if (product_type->product_definition != NULL)
    {
        for (i = 0; i < product_type->num_product_definitions; i++)
        {
            coda_product_definition_delete(product_type->product_definition[i]);
        }
        free(product_type->product_definition);
    }
    free(product_type);
}